

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

CNode * __thiscall
CConnman::ConnectNode
          (CConnman *this,CAddress addrConnect,char *pszDest,bool fCountFailure,
          ConnectionType conn_type,bool use_v2transport)

{
  atomic<long> *paVar1;
  uint64_t data;
  Session *this_00;
  _Elt_pointer puVar2;
  _Map_pointer ppuVar3;
  AddrMan *this_01;
  double dVar4;
  DNSLookupFn dns_lookup_function;
  unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> uVar5;
  _Head_base<0UL,_Sock_*,_false> _Var6;
  pointer pCVar7;
  mutex_type *pmVar8;
  pointer __last;
  _Alloc_hider _Var9;
  bool bVar10;
  uint16_t portDefault;
  uint16_t uVar11;
  Network net;
  Logger *pLVar12;
  size_t sVar13;
  time_point tVar14;
  CNode *pCVar15;
  __uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true> _Var16;
  CSipHasher *pCVar17;
  uint64_t uVar18;
  CAddress *addrIn;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> address;
  int iVar19;
  undefined7 in_register_00000081;
  undefined4 in_R9D;
  char (*args) [3];
  pointer pCVar20;
  pointer __p;
  char *pcVar21;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view in;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  shared_ptr<Sock> sock;
  string_view source_file_02;
  string_view source_file_03;
  CNodeOptions *node_opts;
  CConnman *this_02;
  CConnman *pCVar22;
  undefined2 uVar23;
  undefined6 in_stack_fffffffffffffd62;
  undefined6 uVar24;
  undefined4 in_stack_fffffffffffffd68;
  _Invoker_type in_stack_fffffffffffffd70;
  RecursiveMutex *pRVar25;
  deque<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::allocator<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>>>
  *this_03;
  bool local_280;
  undefined1 local_268 [16];
  uint16_t port;
  undefined6 uStack_256;
  pointer pNStack_250;
  pointer local_248;
  NetPermissionFlags permission_flags;
  unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> i2p_transient_session;
  _Head_base<0UL,_Sock_*,_false> local_230;
  _Any_data local_228;
  code *local_218;
  vector<CAddress,_std::allocator<CAddress>_> local_208;
  char *pszDest_local;
  direct_or_indirect local_1e0;
  uint local_1d0;
  uint64_t local_1c8;
  uint16_t local_1c0;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock28;
  __native_type local_1a8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock27;
  uint local_168;
  vector<CService,_std::allocator<CService>_> resolved;
  direct_or_indirect local_e8;
  uint local_d8;
  undefined8 local_d0;
  undefined2 local_c8;
  string host;
  undefined1 local_a0;
  undefined1 uStack_9f;
  uint32_t uStack_9e;
  uint16_t local_98;
  direct_or_indirect dStack_90;
  uint local_80;
  long local_38;
  
  pszDest_local = (char *)CONCAT71(in_register_00000011,fCountFailure);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar19 = (int)(string *)CONCAT71(in_register_00000081,use_v2transport);
  if (iVar19 == 0) {
    __assert_fail("conn_type != ConnectionType::INBOUND",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                  ,0x187,
                  "CNode *CConnman::ConnectNode(CAddress, const char *, bool, ConnectionType, bool)"
                 );
  }
  if (pszDest_local == (char *)0x0) {
    bVar10 = IsLocal((CService *)pszDest);
    if (!bVar10) {
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&host,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)pszDest);
      host.field_2._8_8_ = *(undefined8 *)(pszDest + 0x18);
      local_a0 = (undefined1)*(undefined2 *)(pszDest + 0x20);
      uStack_9f = (undefined1)((ushort)*(undefined2 *)(pszDest + 0x20) >> 8);
      pCVar15 = FindNode(this,(CService *)&host);
      if (0x10 < (uint)host.field_2._M_allocated_capacity._0_4_) {
        free(host._M_dataplus._M_p);
      }
      if (pCVar15 == (CNode *)0x0) goto LAB_0019d17c;
      logging_function._M_str = "ConnectNode";
      logging_function._M_len = 0xb;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file._M_len = 0x57;
      LogPrintFormatInternal<>
                (logging_function,source_file,0x191,ALL,Info,(ConstevalFormatString<0U>)0x7d19ec);
    }
    pCVar15 = (CNode *)0x0;
    goto LAB_0019e1d3;
  }
LAB_0019d17c:
  pLVar12 = LogInstance();
  bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar12,NET,Debug);
  pcVar21 = pszDest_local;
  this_02 = this;
  if (bVar10) {
    args = (char (*) [3])0x7cab03;
    if ((char)in_R9D != '\0') {
      args = (char (*) [3])0x7c910d;
    }
    if (pszDest_local == (char *)0x0) {
      CService::ToStringAddrPort_abi_cxx11_(&host,(CService *)pszDest);
    }
    else {
      host._M_dataplus._M_p = (pointer)&host.field_2;
      sVar13 = strlen(pszDest_local);
      std::__cxx11::string::_M_construct<char_const*>((string *)&host,pcVar21,pcVar21 + sVar13);
    }
    dVar4 = 0.0;
    if (pszDest_local == (char *)0x0) {
      tVar14 = NodeClock::now();
      dVar4 = (double)((long)tVar14.__d.__r / 1000000000 - *(long *)(pszDest + 0x28));
    }
    resolved.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)(dVar4 / 3600.0);
    logging_function_00._M_str = "ConnectNode";
    logging_function_00._M_len = 0xb;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file_00._M_len = 0x57;
    LogPrintFormatInternal<char[3],std::__cxx11::string,double>
              (logging_function_00,source_file_00,0x199,NET,Debug,
               (ConstevalFormatString<3U>)0x7d1a1e,args,&host,(double *)&resolved);
    this_02 = this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)host._M_dataplus._M_p != &host.field_2) {
      operator_delete(host._M_dataplus._M_p,
                      CONCAT44(host.field_2._M_allocated_capacity._4_4_,
                               host.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  if (pszDest_local == (char *)0x0) {
    portDefault = this->m_params->nDefaultPort;
LAB_0019d43f:
    local_208.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_208.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_finish = (CAddress *)0x0;
    local_208.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_start = (CAddress *)0x0;
    std::vector<CAddress,_std::allocator<CAddress>_>::push_back(&local_208,(value_type *)pszDest);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&host,pszDest_local,(allocator<char> *)&resolved);
    portDefault = GetDefaultPort(this,&host);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)host._M_dataplus._M_p != &host.field_2) {
      operator_delete(host._M_dataplus._M_p,
                      CONCAT44(host.field_2._M_allocated_capacity._4_4_,
                               host.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_208.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_start = (CAddress *)0x0;
    local_208.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_finish = (CAddress *)0x0;
    local_208.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pszDest_local == (char *)0x0) goto LAB_0019d43f;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&host,pszDest_local,(allocator<char> *)&criticalblock27);
    if (fNameLookup == true) {
      bVar10 = HaveNameProxy();
      bVar10 = !bVar10;
      this = this_02;
    }
    else {
      bVar10 = false;
      this = this_02;
    }
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&local_228,&g_dns_lookup_abi_cxx11_);
    dns_lookup_function.super__Function_base._M_functor._8_2_ = portDefault;
    dns_lookup_function.super__Function_base._M_functor._M_unused._M_object = this;
    dns_lookup_function.super__Function_base._M_functor._10_6_ = in_stack_fffffffffffffd62;
    dns_lookup_function.super__Function_base._M_manager._0_4_ = in_stack_fffffffffffffd68;
    dns_lookup_function.super__Function_base._M_manager._4_4_ = in_R9D;
    dns_lookup_function._M_invoker = in_stack_fffffffffffffd70;
    Lookup(&resolved,&host,portDefault,bVar10,0x100,dns_lookup_function);
    if (local_218 != (code *)0x0) {
      (*local_218)(&local_228,&local_228,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)host._M_dataplus._M_p != &host.field_2) {
      operator_delete(host._M_dataplus._M_p,
                      CONCAT44(host.field_2._M_allocated_capacity._4_4_,
                               host.field_2._M_allocated_capacity._0_4_) + 1);
    }
    __last = resolved.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar20 = resolved.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (resolved.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
        super__Vector_impl_data._M_start ==
        resolved.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<CAddress,_std::allocator<CAddress>_>::push_back(&local_208,(value_type *)pszDest);
    }
    else {
      FastRandomContext::FastRandomContext((FastRandomContext *)&host,false);
      std::
      shuffle<__gnu_cxx::__normal_iterator<CService*,std::vector<CService,std::allocator<CService>>>,FastRandomContext>
                ((__normal_iterator<CService_*,_std::vector<CService,_std::allocator<CService>_>_>)
                 pCVar20,(__normal_iterator<CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                          )__last,(FastRandomContext *)&host);
      ChaCha20::~ChaCha20((ChaCha20 *)&host.field_2);
      if (resolved.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
          super__Vector_impl_data._M_start !=
          resolved.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pRVar25 = &this->m_nodes_mutex;
        pCVar20 = resolved.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          MaybeFlipIPv6toCJDNS((CService *)&local_e8.indirect_contents,pCVar20);
          prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                    ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&host,
                     (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_e8.indirect_contents
                    );
          uVar23 = local_c8;
          host.field_2._8_8_ = local_d0;
          local_98 = 0xe100;
          dStack_90.indirect_contents.indirect = (char *)0x0;
          if (0x10 < *(uint *)(pszDest + 0x10)) {
            free(*(void **)pszDest);
          }
          *(pointer *)pszDest = host._M_dataplus._M_p;
          *(size_type *)(pszDest + 8) = host._M_string_length;
          *(undefined4 *)(pszDest + 0x10) = host.field_2._M_allocated_capacity._0_4_;
          host.field_2._M_allocated_capacity._0_4_ = 0;
          *(undefined8 *)(pszDest + 0x18) = host.field_2._8_8_;
          *(undefined2 *)(pszDest + 0x20) = uVar23;
          pszDest[0x28] = '\0';
          pszDest[0x29] = -0x1f;
          pszDest[0x2a] = -0xb;
          pszDest[0x2b] = '\x05';
          pszDest[0x2c] = '\0';
          pszDest[0x2d] = '\0';
          pszDest[0x2e] = '\0';
          pszDest[0x2f] = '\0';
          *(char **)(pszDest + 0x30) = dStack_90.indirect_contents.indirect;
          if (0x10 < local_d8) {
            free(local_e8.indirect_contents.indirect);
            local_e8.indirect_contents.indirect = (char *)0x0;
          }
          bVar10 = CNetAddr::IsValid((CNetAddr *)pszDest);
          if (!bVar10) {
            pLVar12 = LogInstance();
            bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar12,NET,Debug);
            if (bVar10) {
              CService::ToStringAddrPort_abi_cxx11_(&host,(CService *)pszDest);
              logging_function_02._M_str = "ConnectNode";
              logging_function_02._M_len = 0xb;
              source_file_02._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
              ;
              source_file_02._M_len = 0x57;
              LogPrintFormatInternal<std::__cxx11::string,char_const*>
                        (logging_function_02,source_file_02,0x1aa,NET,Debug,
                         (ConstevalFormatString<2U>)0x7d1a48,&host,&pszDest_local);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)host._M_dataplus._M_p != &host.field_2) {
                operator_delete(host._M_dataplus._M_p,
                                CONCAT44(host.field_2._M_allocated_capacity._4_4_,
                                         host.field_2._M_allocated_capacity._0_4_) + 1);
              }
            }
LAB_0019e32b:
            std::vector<CService,_std::allocator<CService>_>::~vector(&resolved);
            pCVar15 = (CNode *)0x0;
            goto LAB_0019e1c6;
          }
          criticalblock27.super_unique_lock._8_8_ =
               criticalblock27.super_unique_lock._8_8_ & 0xffffffffffffff00;
          criticalblock27.super_unique_lock._M_device = &pRVar25->super_recursive_mutex;
          std::unique_lock<std::recursive_mutex>::lock(&criticalblock27.super_unique_lock);
          prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                    ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&host,
                     (prevector<16U,_unsigned_char,_unsigned_int,_int> *)pszDest);
          host.field_2._8_8_ = *(undefined8 *)(pszDest + 0x18);
          local_a0 = (undefined1)*(undefined2 *)(pszDest + 0x20);
          uStack_9f = (undefined1)((ushort)*(undefined2 *)(pszDest + 0x20) >> 8);
          pCVar15 = FindNode(this,(CService *)&host);
          if (0x10 < (uint)host.field_2._M_allocated_capacity._0_4_) {
            free(host._M_dataplus._M_p);
          }
          if (pCVar15 != (CNode *)0x0) {
            CService::ToStringAddrPort_abi_cxx11_(&host,(CService *)pszDest);
            logging_function_03._M_str = "ConnectNode";
            logging_function_03._M_len = 0xb;
            source_file_03._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
            ;
            source_file_03._M_len = 0x57;
            LogPrintFormatInternal<char_const*,std::__cxx11::string>
                      (logging_function_03,source_file_03,0x1b2,ALL,Info,
                       (ConstevalFormatString<2U>)0x7d1a75,&pszDest_local,&host);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)host._M_dataplus._M_p != &host.field_2) {
              operator_delete(host._M_dataplus._M_p,
                              CONCAT44(host.field_2._M_allocated_capacity._4_4_,
                                       host.field_2._M_allocated_capacity._0_4_) + 1);
            }
            std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock27.super_unique_lock)
            ;
            goto LAB_0019e32b;
          }
          std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                    (&local_208,(value_type *)pszDest);
          std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock27.super_unique_lock);
          pCVar20 = pCVar20 + 1;
        } while (pCVar20 !=
                 resolved.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
    }
    std::vector<CService,_std::allocator<CService>_>::~vector(&resolved);
    this_02 = this;
  }
  local_230._M_head_impl = (Sock *)0x0;
  CService::CService((CService *)&resolved);
  CService::CService((CService *)&criticalblock27);
  bVar10 = CNetAddr::IsValid((CNetAddr *)&criticalblock27);
  pCVar7 = local_208.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (bVar10) {
    __assert_fail("!addr_bind.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                  ,0x1c5,
                  "CNode *CConnman::ConnectNode(CAddress, const char *, bool, ConnectionType, bool)"
                 );
  }
  i2p_transient_session._M_t.
  super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t.
  super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  if (local_208.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_208.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_03 = (deque<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::allocator<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>>>
               *)&this->m_unused_i2p_sessions;
    address._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_208.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
         super__Vector_impl_data._M_start;
    do {
      bVar10 = CNetAddr::IsValid((CNetAddr *)address._M_pi);
      if (bVar10) {
        net = CNetAddr::GetNetwork((CNetAddr *)address._M_pi);
        bVar10 = GetProxy(net,(Proxy *)&resolved);
        permission_flags = permission_flags & 0xffffff00;
        if (bVar10 && address._M_pi[1]._M_use_count == 4) {
          host._M_dataplus._M_p = (pointer)0x0;
          CService::CService((CService *)&host._M_string_length);
          CService::CService((CService *)&dStack_90.indirect_contents);
          this_00 = (this_02->m_i2p_sam_session)._M_t.
                    super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                    .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
          if (this_00 == (Session *)0x0) {
            criticalblock28.super_unique_lock._8_8_ =
                 criticalblock28.super_unique_lock._8_8_ & 0xffffffffffffff00;
            criticalblock28.super_unique_lock._M_device =
                 &(this->m_unused_i2p_sessions_mutex).super_mutex;
            std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&criticalblock28);
            puVar2 = (this_02->m_unused_i2p_sessions).c.
                     super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            if ((this_02->m_unused_i2p_sessions).c.
                super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur == puVar2) {
              _Var16.
              super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t
              .super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
              super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                   (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)
                   operator_new(0x118);
              i2p::sam::Session::Session
                        ((Session *)
                         _Var16.
                         super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                         .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl,
                         (Proxy *)&resolved,&this->interruptNet);
              uVar5 = i2p_transient_session;
              _port = (Session *)0x0;
              bVar10 = (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)
                       i2p_transient_session._M_t.
                       super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                       .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl !=
                       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)
                       0x0;
              i2p_transient_session._M_t.
              super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t
              .super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
              super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                   (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                    )(__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                      )_Var16.
                       super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                       .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
              if (bVar10) {
                i2p::sam::Session::~Session
                          ((Session *)
                           uVar5._M_t.
                           super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                           .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl);
                operator_delete((void *)uVar5._M_t.
                                        super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                                        .super__Head_base<0UL,_i2p::sam::Session_*,_false>.
                                        _M_head_impl,0x118);
              }
              std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::
              ~unique_ptr((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                          &port);
            }
            else {
              _Var16.
              super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t
              .super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
              super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                   (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)
                   (puVar2->_M_t).
                   super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                   .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
              (puVar2->_M_t).
              super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t
              .super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
              super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                   (Session *)
                   i2p_transient_session._M_t.
                   super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                   .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
              i2p_transient_session._M_t.
              super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t
              .super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
              super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                   (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                    )(__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                      )_Var16.
                       super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                       .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
              std::
              deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
              ::pop_front((deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                           *)this_03);
            }
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&criticalblock28);
            bVar10 = i2p::sam::Session::Connect
                               ((Session *)
                                i2p_transient_session._M_t.
                                super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                                .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl,
                                (CService *)address._M_pi,(Connection *)&host,
                                (bool *)&permission_flags);
            if (bVar10) goto LAB_0019dc0c;
            criticalblock28.super_unique_lock._8_8_ =
                 criticalblock28.super_unique_lock._8_8_ & 0xffffffffffffff00;
            criticalblock28.super_unique_lock._M_device =
                 &(this->m_unused_i2p_sessions_mutex).super_mutex;
            std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&criticalblock28);
            uVar5 = i2p_transient_session;
            ppuVar3 = (this_02->m_unused_i2p_sessions).c.
                      super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node;
            if (((long)(this_02->m_unused_i2p_sessions).c.
                       super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)(this_02->m_unused_i2p_sessions).c.
                       super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                ((long)(this_02->m_unused_i2p_sessions).c.
                       super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                 (long)(this_02->m_unused_i2p_sessions).c.
                       super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                ((((ulong)((long)ppuVar3 -
                          (long)(this_02->m_unused_i2p_sessions).c.
                                super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                (ulong)(ppuVar3 == (_Map_pointer)0x0)) * 0x40 < 10) {
              i2p_transient_session._M_t.
              super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t
              .super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
              super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                   (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                    )(__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)
                     0x0;
              _port = (Session *)
                      uVar5._M_t.
                      super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                      .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
              std::
              deque<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::allocator<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>>>
              ::emplace_back<i2p::sam::Session*>(this_03,(Session **)&port);
            }
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&criticalblock28);
          }
          else {
            bVar10 = i2p::sam::Session::Connect
                               (this_00,(CService *)address._M_pi,(Connection *)&host,
                                (bool *)&permission_flags);
            if (bVar10) {
LAB_0019dc0c:
              _Var9._M_p = host._M_dataplus._M_p;
              _Var6._M_head_impl = local_230._M_head_impl;
              host._M_dataplus._M_p = (pointer)0x0;
              local_230._M_head_impl = (Sock *)_Var9._M_p;
              if (_Var6._M_head_impl != (Sock *)0x0) {
                (*(_Var6._M_head_impl)->_vptr_Sock[1])();
              }
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                         &local_1e0.indirect_contents,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&host._M_string_length)
              ;
              local_1c8 = CONCAT62(_uStack_9e,CONCAT11(uStack_9f,local_a0));
              local_1c0 = local_98;
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock28,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                         &local_1e0.indirect_contents);
              local_1a8._8_8_ = local_1c8;
              local_1a8.__data.__kind._0_2_ = local_1c0;
              local_1a8.__data.__list.__prev = (__pthread_internal_list *)0x5f5e100;
              local_1a8.__data.__list.__next = (__pthread_internal_list *)0x0;
              if (0x10 < local_168) {
                free(criticalblock27.super_unique_lock._M_device);
              }
              criticalblock27.super_unique_lock._M_device =
                   (mutex_type *)criticalblock28.super_unique_lock._M_device;
              criticalblock27.super_unique_lock._M_owns = criticalblock28.super_unique_lock._M_owns;
              criticalblock27.super_unique_lock._9_7_ = criticalblock28.super_unique_lock._9_7_;
              local_168 = local_1a8.__data.__lock;
              local_1a8.__align = local_1a8.__align & 0xffffffff00000000;
              if (0x10 < local_1d0) {
                free(local_1e0.indirect_contents.indirect);
                local_1e0.indirect_contents.indirect = (char *)0x0;
              }
            }
          }
          if (0x10 < local_80) {
            free(dStack_90.indirect_contents.indirect);
            dStack_90.indirect_contents.indirect = (char *)0x0;
          }
          if (0x10 < (uint)host.field_2._8_4_) {
            free((void *)host._M_string_length);
            host._M_string_length = 0;
          }
LAB_0019de37:
          if (host._M_dataplus._M_p != (pointer)0x0) {
            (**(code **)(*(long *)host._M_dataplus._M_p + 8))();
          }
        }
        else if (bVar10) {
          pLVar12 = LogInstance();
          bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar12,PROXY,Debug);
          if (bVar10) {
            Proxy::ToString_abi_cxx11_(&host,(Proxy *)&resolved);
            CService::ToStringAddrPort_abi_cxx11_
                      ((string *)&criticalblock28,(CService *)address._M_pi);
            logging_function_01._M_str = "ConnectNode";
            logging_function_01._M_len = 0xb;
            source_file_01._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
            ;
            source_file_01._M_len = 0x57;
            LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                      (logging_function_01,source_file_01,0x1ec,PROXY,Debug,
                       (ConstevalFormatString<2U>)0x7d1ac3,&host,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &criticalblock28);
            if ((__native_type *)criticalblock28.super_unique_lock._M_device != &local_1a8) {
              operator_delete(criticalblock28.super_unique_lock._M_device,local_1a8.__align + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)host._M_dataplus._M_p != &host.field_2) {
              operator_delete(host._M_dataplus._M_p,
                              CONCAT44(host.field_2._M_allocated_capacity._4_4_,
                                       host.field_2._M_allocated_capacity._0_4_) + 1);
            }
          }
          CNetAddr::ToStringAddr_abi_cxx11_(&host,(CNetAddr *)address._M_pi);
          uVar11 = CService::GetPort((CService *)address._M_pi);
          ConnectThroughProxy((Proxy *)&criticalblock28,(string *)&resolved,(uint16_t)&host,
                              (bool *)(ulong)uVar11);
          pmVar8 = criticalblock28.super_unique_lock._M_device;
          _Var6._M_head_impl = local_230._M_head_impl;
          criticalblock28.super_unique_lock._M_device = (mutex_type *)0x0;
          local_230._M_head_impl = (Sock *)pmVar8;
          if ((_Var6._M_head_impl != (Sock *)0x0) &&
             ((*(_Var6._M_head_impl)->_vptr_Sock[1])(),
             criticalblock28.super_unique_lock._M_device != (mutex_type *)0x0)) {
            (**(code **)(((criticalblock28.super_unique_lock._M_device)->super___mutex_base).
                         _M_mutex.__align + 8))();
          }
          criticalblock28.super_unique_lock._M_device = (mutex_type *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)host._M_dataplus._M_p != &host.field_2) {
            operator_delete(host._M_dataplus._M_p,
                            CONCAT44(host.field_2._M_allocated_capacity._4_4_,
                                     host.field_2._M_allocated_capacity._0_4_) + 1);
          }
        }
        else {
          ConnectDirectly((CService *)&host,SUB81(address._M_pi,0));
          _Var9 = host._M_dataplus;
          _Var6._M_head_impl = local_230._M_head_impl;
          host._M_dataplus._M_p = (pointer)0x0;
          local_230._M_head_impl = (Sock *)_Var9._M_p;
          if (_Var6._M_head_impl != (Sock *)0x0) {
            (*(_Var6._M_head_impl)->_vptr_Sock[1])();
            goto LAB_0019de37;
          }
        }
        if ((undefined1)permission_flags == None) {
          this_01 = this_02->addrman;
          tVar14 = NodeClock::now();
          local_280 = SUB41(conn_type,0);
          AddrMan::Attempt(this_01,(CService *)address._M_pi,local_280,
                           (NodeSeconds)((long)tVar14.__d.__r / 1000000000));
        }
      }
      else if ((pszDest_local != (char *)0x0) && (bVar10 = GetNameProxy((Proxy *)&resolved), bVar10)
              ) {
        host._M_dataplus._M_p = (pointer)&host.field_2;
        host._M_string_length = 0;
        host.field_2._M_allocated_capacity._0_4_ =
             host.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        port = portDefault;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&criticalblock28,pszDest_local,(allocator<char> *)&permission_flags);
        in._M_str = (char *)criticalblock28.super_unique_lock._M_device;
        in._M_len = criticalblock28.super_unique_lock._8_8_;
        SplitHostPort(in,&port,&host);
        if ((__native_type *)criticalblock28.super_unique_lock._M_device != &local_1a8) {
          operator_delete(criticalblock28.super_unique_lock._M_device,local_1a8.__align + 1);
        }
        ConnectThroughProxy((Proxy *)&criticalblock28,(string *)&resolved,(uint16_t)&host,
                            (bool *)((ulong)_port & 0xffff));
        pmVar8 = criticalblock28.super_unique_lock._M_device;
        _Var6._M_head_impl = local_230._M_head_impl;
        criticalblock28.super_unique_lock._M_device = (mutex_type *)0x0;
        local_230._M_head_impl = (Sock *)pmVar8;
        if ((_Var6._M_head_impl != (Sock *)0x0) &&
           ((*(_Var6._M_head_impl)->_vptr_Sock[1])(),
           criticalblock28.super_unique_lock._M_device != (mutex_type *)0x0)) {
          (**(code **)(((criticalblock28.super_unique_lock._M_device)->super___mutex_base)._M_mutex.
                       __align + 8))();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)host._M_dataplus._M_p != &host.field_2) {
          operator_delete(host._M_dataplus._M_p,
                          CONCAT44(host.field_2._M_allocated_capacity._4_4_,
                                   host.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
      if (local_230._M_head_impl != (Sock *)0x0) {
        permission_flags = None;
        pCVar22 = this_02;
        if (iVar19 == 2) {
          std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::vector
                    ((vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
                     &port,&this_02->vWhitelistedRangeOutgoing);
        }
        else {
          _port = (Session *)0x0;
          pNStack_250 = (pointer)0x0;
          local_248 = (pointer)0x0;
        }
        AddWhitelistPermissionFlags
                  (this_02,&permission_flags,(CNetAddr *)address._M_pi,
                   (vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
                   &port);
        LOCK();
        paVar1 = &this_02->nLastNodeId;
        data = (paVar1->super___atomic_base<long>)._M_i;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
        CSipHasher::CSipHasher((CSipHasher *)&host,this_02->nSeed0,this_02->nSeed1);
        pCVar17 = CSipHasher::Write((CSipHasher *)&host,0xd93e69e2bbfa5735);
        criticalblock28.super_unique_lock._M_device = (mutex_type *)pCVar17->v[0];
        criticalblock28.super_unique_lock._8_8_ = pCVar17->v[1];
        local_1a8.__align = pCVar17->v[2];
        local_1a8._8_8_ = pCVar17->v[3];
        local_1a8._16_8_ = pCVar17->tmp;
        local_1a8.__data.__list.__prev = (__pthread_internal_list *)*(undefined8 *)&pCVar17->count;
        pCVar17 = CSipHasher::Write((CSipHasher *)&criticalblock28,data);
        uVar18 = CSipHasher::Finalize(pCVar17);
        bVar10 = CNetAddr::IsValid((CNetAddr *)&criticalblock27);
        if (!bVar10) {
          GetBindAddress((CAddress *)&host,local_230._M_head_impl);
          if (0x10 < local_168) {
            free(criticalblock27.super_unique_lock._M_device);
          }
          criticalblock27.super_unique_lock._M_device = (mutex_type *)host._M_dataplus._M_p;
          criticalblock27.super_unique_lock._8_8_ = host._M_string_length;
          local_168 = host.field_2._M_allocated_capacity._0_4_;
          host.field_2._M_allocated_capacity._0_4_ = 0;
        }
        pCVar15 = (CNode *)operator_new(0x3a8);
        std::__shared_ptr<Sock,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<Sock,std::default_delete<Sock>,void>
                  ((__shared_ptr<Sock,(__gnu_cxx::_Lock_policy)2> *)local_268,
                   (unique_ptr<Sock,_std::default_delete<Sock>_> *)&local_230);
        uVar23 = (undefined2)uVar18;
        uVar24 = (undefined6)(uVar18 >> 0x10);
        addrIn = (CAddress *)CalculateKeyedNetGroup(this_02,(CAddress *)address._M_pi);
        pcVar21 = "";
        if (pszDest_local != (char *)0x0) {
          pcVar21 = pszDest_local;
        }
        criticalblock28.super_unique_lock._M_device = (mutex_type *)&local_1a8;
        sVar13 = strlen(pcVar21);
        node_opts = (CNodeOptions *)0x19e085;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&criticalblock28,pcVar21,pcVar21 + sVar13);
        host._M_dataplus._M_p._0_4_ = permission_flags;
        host._M_string_length =
             (size_type)
             i2p_transient_session._M_t.
             super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t.
             super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
             super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
        i2p_transient_session._M_t.
        super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t.
        super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
        super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
             (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
             )(__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
        host.field_2._M_allocated_capacity._0_4_ =
             host.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        host.field_2._8_8_ = ZEXT48(pCVar22->nReceiveFloodSize);
        sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = address._M_pi;
        sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_268
        ;
        CNode::CNode(pCVar15,data,sock,addrIn,CONCAT62(uVar24,uVar23),(uint64_t)&criticalblock27,
                     (CAddress *)&criticalblock28,
                     (string *)CONCAT71(in_register_00000081,use_v2transport),INBOUND,SUB81(&host,0)
                     ,node_opts);
        std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
                  ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                   &host._M_string_length);
        if ((__native_type *)criticalblock28.super_unique_lock._M_device != &local_1a8) {
          operator_delete(criticalblock28.super_unique_lock._M_device,local_1a8.__align + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
        }
        LOCK();
        (pCVar15->nRefCount).super___atomic_base<int>._M_i =
             (pCVar15->nRefCount).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        RandAddEvent((uint32_t)data);
        std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::~vector
                  ((vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
                   &port);
        goto LAB_0019e159;
      }
      address._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&address._M_pi[3]._M_use_count
      ;
    } while ((pointer)address._M_pi != pCVar7);
  }
  pCVar15 = (CNode *)0x0;
LAB_0019e159:
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            (&i2p_transient_session);
  if (0x10 < local_168) {
    free(criticalblock27.super_unique_lock._M_device);
  }
  if (0x10 < (uint)resolved.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
    free(resolved.super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
         super__Vector_impl_data._M_start);
  }
  if (local_230._M_head_impl != (Sock *)0x0) {
    (*(local_230._M_head_impl)->_vptr_Sock[1])();
  }
LAB_0019e1c6:
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_208);
LAB_0019e1d3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pCVar15;
  }
  __stack_chk_fail();
}

Assistant:

CNode* CConnman::ConnectNode(CAddress addrConnect, const char *pszDest, bool fCountFailure, ConnectionType conn_type, bool use_v2transport)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    assert(conn_type != ConnectionType::INBOUND);

    if (pszDest == nullptr) {
        if (IsLocal(addrConnect))
            return nullptr;

        // Look for an existing connection
        CNode* pnode = FindNode(static_cast<CService>(addrConnect));
        if (pnode)
        {
            LogPrintf("Failed to open new connection, already connected\n");
            return nullptr;
        }
    }

    LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "trying %s connection %s lastseen=%.1fhrs\n",
        use_v2transport ? "v2" : "v1",
        pszDest ? pszDest : addrConnect.ToStringAddrPort(),
        Ticks<HoursDouble>(pszDest ? 0h : Now<NodeSeconds>() - addrConnect.nTime));

    // Resolve
    const uint16_t default_port{pszDest != nullptr ? GetDefaultPort(pszDest) :
                                                     m_params.GetDefaultPort()};

    // Collection of addresses to try to connect to: either all dns resolved addresses if a domain name (pszDest) is provided, or addrConnect otherwise.
    std::vector<CAddress> connect_to{};
    if (pszDest) {
        std::vector<CService> resolved{Lookup(pszDest, default_port, fNameLookup && !HaveNameProxy(), 256)};
        if (!resolved.empty()) {
            std::shuffle(resolved.begin(), resolved.end(), FastRandomContext());
            // If the connection is made by name, it can be the case that the name resolves to more than one address.
            // We don't want to connect any more of them if we are already connected to one
            for (const auto& r : resolved) {
                addrConnect = CAddress{MaybeFlipIPv6toCJDNS(r), NODE_NONE};
                if (!addrConnect.IsValid()) {
                    LogDebug(BCLog::NET, "Resolver returned invalid address %s for %s\n", addrConnect.ToStringAddrPort(), pszDest);
                    return nullptr;
                }
                // It is possible that we already have a connection to the IP/port pszDest resolved to.
                // In that case, drop the connection that was just created.
                LOCK(m_nodes_mutex);
                CNode* pnode = FindNode(static_cast<CService>(addrConnect));
                if (pnode) {
                    LogPrintf("Not opening a connection to %s, already connected to %s\n", pszDest, addrConnect.ToStringAddrPort());
                    return nullptr;
                }
                // Add the address to the resolved addresses vector so we can try to connect to it later on
                connect_to.push_back(addrConnect);
            }
        } else {
            // For resolution via proxy
            connect_to.push_back(addrConnect);
        }
    } else {
        // Connect via addrConnect directly
        connect_to.push_back(addrConnect);
    }

    // Connect
    std::unique_ptr<Sock> sock;
    Proxy proxy;
    CAddress addr_bind;
    assert(!addr_bind.IsValid());
    std::unique_ptr<i2p::sam::Session> i2p_transient_session;

    for (auto& target_addr: connect_to) {
        if (target_addr.IsValid()) {
            const bool use_proxy{GetProxy(target_addr.GetNetwork(), proxy)};
            bool proxyConnectionFailed = false;

            if (target_addr.IsI2P() && use_proxy) {
                i2p::Connection conn;
                bool connected{false};

                if (m_i2p_sam_session) {
                    connected = m_i2p_sam_session->Connect(target_addr, conn, proxyConnectionFailed);
                } else {
                    {
                        LOCK(m_unused_i2p_sessions_mutex);
                        if (m_unused_i2p_sessions.empty()) {
                            i2p_transient_session =
                                std::make_unique<i2p::sam::Session>(proxy, &interruptNet);
                        } else {
                            i2p_transient_session.swap(m_unused_i2p_sessions.front());
                            m_unused_i2p_sessions.pop();
                        }
                    }
                    connected = i2p_transient_session->Connect(target_addr, conn, proxyConnectionFailed);
                    if (!connected) {
                        LOCK(m_unused_i2p_sessions_mutex);
                        if (m_unused_i2p_sessions.size() < MAX_UNUSED_I2P_SESSIONS_SIZE) {
                            m_unused_i2p_sessions.emplace(i2p_transient_session.release());
                        }
                    }
                }

                if (connected) {
                    sock = std::move(conn.sock);
                    addr_bind = CAddress{conn.me, NODE_NONE};
                }
            } else if (use_proxy) {
                LogPrintLevel(BCLog::PROXY, BCLog::Level::Debug, "Using proxy: %s to connect to %s\n", proxy.ToString(), target_addr.ToStringAddrPort());
                sock = ConnectThroughProxy(proxy, target_addr.ToStringAddr(), target_addr.GetPort(), proxyConnectionFailed);
            } else {
                // no proxy needed (none set for target network)
                sock = ConnectDirectly(target_addr, conn_type == ConnectionType::MANUAL);
            }
            if (!proxyConnectionFailed) {
                // If a connection to the node was attempted, and failure (if any) is not caused by a problem connecting to
                // the proxy, mark this as an attempt.
                addrman.Attempt(target_addr, fCountFailure);
            }
        } else if (pszDest && GetNameProxy(proxy)) {
            std::string host;
            uint16_t port{default_port};
            SplitHostPort(std::string(pszDest), port, host);
            bool proxyConnectionFailed;
            sock = ConnectThroughProxy(proxy, host, port, proxyConnectionFailed);
        }
        // Check any other resolved address (if any) if we fail to connect
        if (!sock) {
            continue;
        }

        NetPermissionFlags permission_flags = NetPermissionFlags::None;
        std::vector<NetWhitelistPermissions> whitelist_permissions = conn_type == ConnectionType::MANUAL ? vWhitelistedRangeOutgoing : std::vector<NetWhitelistPermissions>{};
        AddWhitelistPermissionFlags(permission_flags, target_addr, whitelist_permissions);

        // Add node
        NodeId id = GetNewNodeId();
        uint64_t nonce = GetDeterministicRandomizer(RANDOMIZER_ID_LOCALHOSTNONCE).Write(id).Finalize();
        if (!addr_bind.IsValid()) {
            addr_bind = GetBindAddress(*sock);
        }
        CNode* pnode = new CNode(id,
                                std::move(sock),
                                target_addr,
                                CalculateKeyedNetGroup(target_addr),
                                nonce,
                                addr_bind,
                                pszDest ? pszDest : "",
                                conn_type,
                                /*inbound_onion=*/false,
                                CNodeOptions{
                                    .permission_flags = permission_flags,
                                    .i2p_sam_session = std::move(i2p_transient_session),
                                    .recv_flood_size = nReceiveFloodSize,
                                    .use_v2transport = use_v2transport,
                                });
        pnode->AddRef();

        // We're making a new connection, harvest entropy from the time (and our peer count)
        RandAddEvent((uint32_t)id);

        return pnode;
    }

    return nullptr;
}